

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::deep_equal(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  bool local_31;
  int local_24;
  int ind;
  RegularExpression *rxp_local;
  RegularExpression *this_local;
  
  local_24 = this->progsize;
  if (this->progsize == rxp->progsize) {
    do {
      iVar1 = local_24 + -1;
      if (local_24 == 0) {
        local_31 = false;
        if (this->startp[0] == rxp->startp[0]) {
          local_31 = this->endp[0] == rxp->endp[0];
        }
        return local_31;
      }
      local_24 = iVar1;
    } while (this->program[iVar1] == rxp->program[iVar1]);
  }
  return false;
}

Assistant:

bool RegularExpression::deep_equal(const RegularExpression& rxp) const
{
  int ind = this->progsize;                     // Get regular expression size
  if (ind != rxp.progsize)                      // If different size regexp
    return false;                               // Return failure
  while (ind-- != 0)                            // Else while still characters
    if (this->program[ind] != rxp.program[ind]) // If regexp are different
      return false;                             // Return failure
  return (this->startp[0] == rxp.startp[0] &&   // Else if same start/end ptrs,
          this->endp[0] == rxp.endp[0]);        // Return true
}